

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder_mf.c
# Opt level: O3

lzma_match *
bt_find_func(uint32_t len_limit,uint32_t pos,uint8_t *cur,uint32_t cur_match,uint32_t depth,
            uint32_t *son,uint32_t cyclic_pos,uint32_t cyclic_size,lzma_match *matches,
            uint32_t len_best)

{
  uint uVar1;
  ulong uVar2;
  uint32_t uVar3;
  uint uVar4;
  uint32_t *puVar5;
  uint uVar6;
  uint uVar7;
  uint32_t local_54;
  lzma_match *local_50;
  uint32_t *local_48;
  uint32_t *local_40;
  
  local_50 = matches;
  local_48 = son + cyclic_pos * 2;
  local_40 = son + (ulong)(cyclic_pos * 2) + 1;
  uVar7 = pos - cur_match;
  if (uVar7 < cyclic_size && depth != 0) {
    local_54 = len_best;
    uVar4 = 0;
    uVar6 = 0;
    do {
      uVar3 = 0;
      if (cyclic_pos < uVar7) {
        uVar3 = cyclic_size;
      }
      uVar1 = uVar4;
      if (uVar6 < uVar4) {
        uVar1 = uVar6;
      }
      uVar2 = (ulong)uVar1;
      puVar5 = son + ((cyclic_pos - uVar7) + uVar3) * 2;
      if (cur[uVar2 - uVar7] == cur[uVar2]) {
        do {
          uVar1 = uVar1 + 1;
          if (len_limit == uVar1) {
            if (local_54 < len_limit) {
              local_50->len = len_limit;
              local_50->dist = uVar7 - 1;
              *local_48 = *puVar5;
              *local_40 = puVar5[1];
              return local_50 + 1;
            }
            uVar2 = (ulong)len_limit;
            goto LAB_0049e1c8;
          }
        } while (cur[(ulong)uVar1 - (ulong)uVar7] == cur[uVar1]);
        uVar2 = (ulong)uVar1;
        if (local_54 < uVar1) {
          local_50->len = uVar1;
          local_50->dist = uVar7 - 1;
          local_50 = local_50 + 1;
          local_54 = uVar1;
        }
      }
LAB_0049e1c8:
      if (cur[uVar2 - uVar7] < cur[uVar2]) {
        *local_48 = cur_match;
        puVar5 = puVar5 + 1;
        uVar4 = (uint)uVar2;
        local_48 = puVar5;
      }
      else {
        *local_40 = cur_match;
        uVar6 = (uint)uVar2;
        local_40 = puVar5;
      }
      depth = depth - 1;
      if (depth == 0) break;
      cur_match = *puVar5;
      uVar7 = pos - cur_match;
    } while (uVar7 < cyclic_size);
  }
  *local_40 = 0;
  *local_48 = 0;
  return local_50;
}

Assistant:

static lzma_match *
bt_find_func(
		const uint32_t len_limit,
		const uint32_t pos,
		const uint8_t *const cur,
		uint32_t cur_match,
		uint32_t depth,
		uint32_t *const son,
		const uint32_t cyclic_pos,
		const uint32_t cyclic_size,
		lzma_match *matches,
		uint32_t len_best)
{
	uint32_t *ptr0 = son + (cyclic_pos << 1) + 1;
	uint32_t *ptr1 = son + (cyclic_pos << 1);

	uint32_t len0 = 0;
	uint32_t len1 = 0;

	while (true) {
		uint32_t *pair;
		const uint8_t *pb;
		uint32_t len;

		const uint32_t delta = pos - cur_match;
		if (depth-- == 0 || delta >= cyclic_size) {
			*ptr0 = EMPTY_HASH_VALUE;
			*ptr1 = EMPTY_HASH_VALUE;
			return matches;
		}

		pair = son + ((cyclic_pos - delta
				+ (delta > cyclic_pos ? cyclic_size : 0))
				<< 1);

		pb = cur - delta;
		len = my_min(len0, len1);

		if (pb[len] == cur[len]) {
			while (++len != len_limit)
				if (pb[len] != cur[len])
					break;

			if (len_best < len) {
				len_best = len;
				matches->len = len;
				matches->dist = delta - 1;
				++matches;

				if (len == len_limit) {
					*ptr1 = pair[0];
					*ptr0 = pair[1];
					return matches;
				}
			}
		}

		if (pb[len] < cur[len]) {
			*ptr1 = cur_match;
			ptr1 = pair + 1;
			cur_match = *ptr1;
			len1 = len;
		} else {
			*ptr0 = cur_match;
			ptr0 = pair;
			cur_match = *ptr0;
			len0 = len;
		}
	}
}